

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_wstring.cpp
# Opt level: O0

bool __thiscall ON_wString::StartsWithNoCase(ON_wString *this,wchar_t *wszSub)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  ON_wStringHeader *pOVar4;
  int local_2c;
  int i;
  size_t lenSub;
  wchar_t *wszSub_local;
  ON_wString *this_local;
  
  sVar3 = wcslen(wszSub);
  if (sVar3 == 0) {
    this_local._7_1_ = false;
  }
  else {
    pOVar4 = Header(this);
    if ((ulong)(long)pOVar4->string_length < sVar3) {
      this_local._7_1_ = false;
    }
    else {
      for (local_2c = 0; (ulong)(long)local_2c < sVar3; local_2c = local_2c + 1) {
        iVar1 = tolower(this->m_s[local_2c]);
        iVar2 = tolower(wszSub[local_2c]);
        if (iVar1 != iVar2) {
          return false;
        }
      }
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool ON_wString::StartsWithNoCase(const wchar_t* wszSub) const
{
  const auto lenSub = wcslen(wszSub);
  if (0 == lenSub)
    return false;

  if (lenSub > Header()->string_length)
    return false;

  for (int i = 0; i < lenSub; i++)
  {
    if (tolower(m_s[i]) != tolower(wszSub[i]))
      return false;
  }

  return true;
}